

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariable.hpp
# Opt level: O0

void __thiscall gmlc::concurrency::TriggerVariable::reset(TriggerVariable *this)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> lk;
  mutex_type *in_stack_ffffffffffffffc8;
  TriggerVariable *in_stack_ffffffffffffffd8;
  
  std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffc8);
  bVar1 = std::atomic<bool>::load
                    (&in_stack_ffffffffffffffd8->triggered,(memory_order)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    while (bVar1 = std::atomic<bool>::load
                             (&in_stack_ffffffffffffffd8->triggered,
                              (memory_order)((ulong)in_RDI >> 0x20)), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::unique_lock<std::mutex>::unlock(in_RDI);
      trigger(in_stack_ffffffffffffffd8);
      std::unique_lock<std::mutex>::lock(in_RDI);
    }
    std::atomic<bool>::store
              (&in_stack_ffffffffffffffd8->triggered,SUB81((ulong)in_RDI >> 0x38,0),
               (memory_order)in_RDI);
  }
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  return;
}

Assistant:

void reset()
    {
        std::unique_lock<std::mutex> lk(activeLock);
        if (activated.load()) {
            while (!triggered.load(std::memory_order_acquire)) {
                lk.unlock();
                trigger();
                lk.lock();
            }
            activated.store(false);
        }
    }